

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O1

int hessian_fd(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f)

{
  size_t sVar1;
  double *__dest;
  double *__dest_00;
  double *__dest_01;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  char *__format;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *local_60;
  
  dVar6 = pow(eps,0.3333333333333333);
  sVar1 = (long)N * 8;
  __dest = (double *)malloc(sVar1);
  __dest_00 = (double *)malloc(sVar1);
  __dest_01 = (double *)malloc(sVar1);
  if (N < 1) {
    iVar3 = 0;
  }
  else {
    uVar2 = (ulong)(uint)N;
    sVar1 = uVar2 * 8;
    uVar5 = 0;
    local_60 = f;
    do {
      dVar7 = x[uVar5];
      if (ABS(dVar7) < 1.0 / ABS(dx[uVar5])) {
        dVar7 = signx(dVar7);
        dVar7 = dVar7 / ABS(dx[uVar5]);
      }
      dVar7 = dVar7 * dVar6;
      memcpy(__dest,x,sVar1);
      memcpy(__dest_00,x,sVar1);
      memcpy(__dest_01,x,sVar1);
      __dest[uVar5] = __dest[uVar5] + dVar7;
      __dest_01[uVar5] = __dest_01[uVar5] + dVar7;
      uVar4 = 0;
      do {
        dVar8 = x[uVar4];
        if (ABS(dVar8) < 1.0 / ABS(dx[uVar4])) {
          dVar8 = signx(dVar8);
          dVar8 = dVar8 / ABS(dx[uVar4]);
        }
        dVar8 = dVar8 * dVar6;
        __dest_00[uVar4] = __dest_00[uVar4] + dVar8;
        __dest_01[uVar4] = __dest_01[uVar4] + dVar8;
        dVar9 = (*funcpt->funcpt)(__dest_01,N,funcpt->params);
        dVar10 = (*funcpt->funcpt)(__dest,N,funcpt->params);
        dVar11 = (*funcpt->funcpt)(__dest_00,N,funcpt->params);
        dVar12 = (*funcpt->funcpt)(x,N,funcpt->params);
        dVar9 = ((dVar9 - dVar10) - (dVar11 - dVar12)) / (dVar7 * dVar8);
        local_60[uVar4] = dVar9;
        if (1.79769313486232e+308 <= ABS(dVar9)) {
          __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_0012393a:
          printf(__format);
          iVar3 = 0xf;
          goto LAB_00123946;
        }
        if (NAN(dVar9)) {
          __format = "Program Exiting as the function returns NaN";
          goto LAB_0012393a;
        }
        __dest_00[uVar4] = __dest_00[uVar4] - dVar8;
        __dest_01[uVar4] = __dest_01[uVar4] - dVar8;
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
      uVar5 = uVar5 + 1;
      local_60 = local_60 + uVar2;
      iVar3 = 0;
    } while (uVar5 != uVar2);
  }
LAB_00123946:
  free(__dest);
  free(__dest_00);
  free(__dest_01);
  return iVar3;
}

Assistant:

int hessian_fd(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f) {
	int i,j,retval;
	double stepi,stepj,fd,stepmax;
	double *xi,*xj,*xij;
	
	retval = 0;

	fd = pow((double) eps,1.0/3.0);
	xi = (double*) malloc(sizeof(double) *N);
	xj = (double*) malloc(sizeof(double) *N);
	xij = (double*) malloc(sizeof(double) *N);
	
	for(i = 0; i < N;++i) {
		if (fabs(x[i]) >= 1.0 / fabs(dx[i])) {
			stepmax = x[i];
		} else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		stepi = fd * stepmax;
		for(j = 0; j < N;++j) {
			xi[j] = x[j];
			xj[j]= x[j];
			xij[j] = x[j];
		}
		xi[i] += stepi;
		xij[i] += stepi;
		for(j = 0; j < N;++j) {
			if (fabs(x[j]) >= 1.0 / fabs(dx[j])) {
				stepmax = x[j];
			} else {
				stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
			}
			stepj = fd * stepmax;
			xj[j] += stepj;
			xij[j] += stepj;

			f[i*N+j] = ((FUNCPT_EVAL(funcpt,xij,N) - FUNCPT_EVAL(funcpt,xi,N)) - (FUNCPT_EVAL(funcpt,xj,N) - FUNCPT_EVAL(funcpt,x,N)))/(stepi * stepj);
			if (f[i*N+j] >= DBL_MAX || f[i*N+j] <= -DBL_MAX) {
				printf("Program Exiting as the function value exceeds the maximum double value");
				free(xi);
				free(xj);
				free(xij);
				return 15;
			}
			if (f[i*N+j] != f[i*N+j]) {
				printf("Program Exiting as the function returns NaN");
				free(xi);
				free(xj);
				free(xij);
				return 15;
			}
			xj[j] -= stepj;
			xij[j] -= stepj;
		}

	}
	
	free(xi);
	free(xj);
	free(xij);
	return retval;
	
}